

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O2

void Fossilize::DatabaseInterface::get_unique_os_export_name(char *buffer,size_t size)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = name_counter;
  LOCK();
  name_counter = name_counter + 1;
  UNLOCK();
  uVar2 = getpid();
  snprintf(buffer,size,"/fossilize-replayer-%d-%u",(ulong)uVar2,(ulong)uVar1);
  return;
}

Assistant:

void DatabaseInterface::get_unique_os_export_name(char *buffer, size_t size)
{
	unsigned counter_value = name_counter.fetch_add(1);
#ifdef _WIN32
	snprintf(buffer, size, "fossilize-replayer-%lu-%u", GetCurrentProcessId(), counter_value);
#else
	snprintf(buffer, size, "/fossilize-replayer-%d-%u", getpid(), counter_value);
#endif
}